

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FFontChar2::~FFontChar2(FFontChar2 *this)

{
  FFontChar2 *this_local;
  
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FFontChar2_009fd3c8;
  (*(this->super_FTexture)._vptr_FTexture[9])();
  if (this->Spans != (Span **)0x0) {
    FTexture::FreeSpans(&this->super_FTexture,this->Spans);
    this->Spans = (Span **)0x0;
  }
  FTexture::~FTexture(&this->super_FTexture);
  return;
}

Assistant:

FFontChar2::~FFontChar2 ()
{
	Unload ();
	if (Spans != NULL)
	{
		FreeSpans (Spans);
		Spans = NULL;
	}
}